

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O2

DWord __thiscall
absl::synchronization_internal::KernelTimeout::InMillisecondsFromNow(KernelTimeout *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  if (this->rep_ != 0xffffffffffffffff) {
    uVar1 = InNanosecondsFromNow(this);
    if (uVar1 < 0x7ffffffffff0bdc0) {
      uVar2 = (uVar1 + 999999) / 1000000;
    }
  }
  return uVar2;
}

Assistant:

KernelTimeout::DWord KernelTimeout::InMillisecondsFromNow() const {
  constexpr DWord kInfinite = std::numeric_limits<DWord>::max();

  if (!has_timeout()) {
    return kInfinite;
  }

  constexpr uint64_t kNanosInMillis = uint64_t{1'000'000};
  constexpr uint64_t kMaxValueNanos =
      std::numeric_limits<int64_t>::max() - kNanosInMillis + 1;

  uint64_t ns_from_now = static_cast<uint64_t>(InNanosecondsFromNow());
  if (ns_from_now >= kMaxValueNanos) {
    // Rounding up would overflow.
    return kInfinite;
  }
  // Convert to milliseconds, always rounding up.
  uint64_t ms_from_now = (ns_from_now + kNanosInMillis - 1) / kNanosInMillis;
  if (ms_from_now > kInfinite) {
    return kInfinite;
  }
  return static_cast<DWord>(ms_from_now);
}